

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

Ref<anurbs::Brep> __thiscall
pybind11::detail::argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Brep>>::
call_impl<anurbs::Ref<anurbs::Brep>,anurbs::Ref<anurbs::Brep>(*&)(anurbs::Model&,std::shared_ptr<anurbs::Brep>),0ul,1ul,pybind11::detail::void_type>
          (argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Brep>> *this,
          tuple<pybind11::detail::type_caster<anurbs::Model,_void>,_pybind11::detail::type_caster<std::shared_ptr<anurbs::Brep>,_void>_>
          *f,void_type *param_3,undefined8 param_4)

{
  code *pcVar1;
  __tuple_element_t<0UL,_tuple<type_caster<Model,_void>,_type_caster<shared_ptr<Brep>,_void>_>_>
  *caster;
  template_cast_op_type<typename_std::add_rvalue_reference<Model_&>::type> pMVar2;
  __tuple_element_t<1UL,_tuple<type_caster<Model,_void>,_type_caster<shared_ptr<Brep>,_void>_>_>
  *caster_00;
  template_cast_op_type<typename_std::add_rvalue_reference<shared_ptr<Brep>_>::type> psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Brep> RVar4;
  shared_ptr<anurbs::Brep> local_40;
  undefined8 local_30;
  void_type *param_3_local;
  _func_Ref<anurbs::Brep>_Model_ptr_shared_ptr<anurbs::Brep> **f_local;
  argument_loader<anurbs::Model_&,_std::shared_ptr<anurbs::Brep>_> *this_local;
  argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Brep>> *local_10;
  
  pcVar1 = *(code **)param_3;
  local_30 = param_4;
  param_3_local = param_3;
  f_local = (_func_Ref<anurbs::Brep>_Model_ptr_shared_ptr<anurbs::Brep> **)f;
  local_10 = this;
  caster = std::
           get<0ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::Brep>,void>>
                     (f);
  pMVar2 = cast_op<anurbs::Model&>(caster);
  caster_00 = std::
              get<1ul,pybind11::detail::type_caster<anurbs::Model,void>,pybind11::detail::type_caster<std::shared_ptr<anurbs::Brep>,void>>
                        (f);
  psVar3 = cast_op<std::shared_ptr<anurbs::Brep>>(caster_00);
  std::shared_ptr<anurbs::Brep>::shared_ptr(&local_40,psVar3);
  (*pcVar1)(this,pMVar2,&local_40);
  std::shared_ptr<anurbs::Brep>::~shared_ptr(&local_40);
  RVar4.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar4.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ref<anurbs::Brep>)
         RVar4.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }